

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dauNonDsd.c
# Opt level: O2

Vec_Int_t * Dau_DecFindSets(word *pInit,int nVars)

{
  int *piVar1;
  Vec_Int_t *pVVar2;
  long lVar3;
  int *pSched [16];
  
  pSched[0xe] = (int *)0x0;
  pSched[0xf] = (int *)0x0;
  pSched[0xc] = (int *)0x0;
  pSched[0xd] = (int *)0x0;
  pSched[10] = (int *)0x0;
  pSched[0xb] = (int *)0x0;
  pSched[8] = (int *)0x0;
  pSched[9] = (int *)0x0;
  pSched[6] = (int *)0x0;
  pSched[7] = (int *)0x0;
  pSched[4] = (int *)0x0;
  pSched[5] = (int *)0x0;
  pSched[2] = (int *)0x0;
  pSched[3] = (int *)0x0;
  pSched[0] = (int *)0x0;
  pSched[1] = (int *)0x0;
  for (lVar3 = 2; lVar3 < nVars; lVar3 = lVar3 + 1) {
    piVar1 = Extra_GreyCodeSchedule((int)lVar3);
    pSched[lVar3] = piVar1;
  }
  pVVar2 = Dau_DecFindSets_int(pInit,nVars,pSched);
  for (lVar3 = 2; lVar3 < nVars; lVar3 = lVar3 + 1) {
    if (pSched[lVar3] != (int *)0x0) {
      free(pSched[lVar3]);
      pSched[lVar3] = (int *)0x0;
    }
  }
  return pVVar2;
}

Assistant:

Vec_Int_t * Dau_DecFindSets( word * pInit, int nVars )
{
    Vec_Int_t * vSets;
    int v, * pSched[16] = {NULL};
    for ( v = 2; v < nVars; v++ )
        pSched[v] = Extra_GreyCodeSchedule( v );
    vSets = Dau_DecFindSets_int( pInit, nVars, pSched );
    for ( v = 2; v < nVars; v++ )
        ABC_FREE( pSched[v] );
    return vSets;
}